

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

time_t lha_win_time(uint64_t wintime,long *ns)

{
  long *ns_local;
  uint64_t wintime_local;
  
  if (wintime < 0x19db1ded53e8000) {
    if (ns != (long *)0x0) {
      *ns = 0;
    }
    wintime_local = 0;
  }
  else {
    if (ns != (long *)0x0) {
      *ns = ((wintime + 0xfe624e212ac18000) % 10000000) * 100;
    }
    wintime_local = (wintime + 0xfe624e212ac18000) / 10000000;
  }
  return wintime_local;
}

Assistant:

static time_t
lha_win_time(uint64_t wintime, long *ns)
{
#define EPOC_TIME ARCHIVE_LITERAL_ULL(116444736000000000)

	if (wintime >= EPOC_TIME) {
		wintime -= EPOC_TIME;	/* 1970-01-01 00:00:00 (UTC) */
		if (ns != NULL)
			*ns = (long)(wintime % 10000000) * 100;
		return (wintime / 10000000);
	} else {
		if (ns != NULL)
			*ns = 0;
		return (0);
	}
}